

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O3

int do_i2r_name_constraints
              (X509V3_EXT_METHOD *method,stack_st_GENERAL_SUBTREE *trees,BIO *bp,int ind,char *name)

{
  ushort uVar1;
  int iVar2;
  GENERAL_NAME *gen;
  ASN1_STRING *pAVar3;
  size_t sVar4;
  undefined8 *puVar5;
  undefined4 in_register_0000000c;
  char *buf;
  size_t i;
  long lVar6;
  
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)method);
  if (sVar4 != 0) {
    BIO_printf((BIO *)trees,"%*s%s:\n",(ulong)bp & 0xffffffff,"",CONCAT44(in_register_0000000c,ind))
    ;
  }
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)method);
  if (sVar4 != 0) {
    i = 0;
    do {
      puVar5 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)method,i);
      BIO_printf((BIO *)trees,"%*s",(ulong)((int)bp + 2),"");
      gen = (GENERAL_NAME *)*puVar5;
      if (gen->type == 7) {
        iVar2 = *(int *)&((gen->d).ediPartyName)->nameAssigner;
        pAVar3 = ((gen->d).ediPartyName)->partyName;
        BIO_puts((BIO *)trees,"IP:");
        if (iVar2 == 8) {
          BIO_printf((BIO *)trees,"%d.%d.%d.%d/%d.%d.%d.%d",(ulong)(byte)pAVar3->length,
                     (ulong)*(byte *)((long)&pAVar3->length + 1),
                     (ulong)*(byte *)((long)&pAVar3->length + 2),
                     (ulong)*(byte *)((long)&pAVar3->length + 3),(ulong)(byte)pAVar3->type,
                     (ulong)*(byte *)((long)&pAVar3->type + 1),
                     (ulong)*(byte *)((long)&pAVar3->type + 2),
                     (ulong)*(byte *)((long)&pAVar3->type + 3));
        }
        else {
          if (iVar2 == 0x20) {
            lVar6 = 0;
            do {
              uVar1 = *(ushort *)((long)&pAVar3->length + lVar6 * 2);
              BIO_printf((BIO *)trees,"%X",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
              buf = "/";
              if ((int)lVar6 != 7) {
                if ((int)lVar6 == 0xf) goto LAB_00317fcf;
                buf = ":";
              }
              BIO_puts((BIO *)trees,buf);
              lVar6 = lVar6 + 1;
            } while( true );
          }
          BIO_printf((BIO *)trees,"IP Address:<invalid>");
        }
      }
      else {
        GENERAL_NAME_print((BIO *)trees,gen);
      }
LAB_00317fcf:
      BIO_puts((BIO *)trees,"\n");
      i = i + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)method);
    } while (i < sVar4);
  }
  return (int)sVar4;
}

Assistant:

static int do_i2r_name_constraints(const X509V3_EXT_METHOD *method,
                                   STACK_OF(GENERAL_SUBTREE) *trees, BIO *bp,
                                   int ind, const char *name) {
  GENERAL_SUBTREE *tree;
  size_t i;
  if (sk_GENERAL_SUBTREE_num(trees) > 0) {
    BIO_printf(bp, "%*s%s:\n", ind, "", name);
  }
  for (i = 0; i < sk_GENERAL_SUBTREE_num(trees); i++) {
    tree = sk_GENERAL_SUBTREE_value(trees, i);
    BIO_printf(bp, "%*s", ind + 2, "");
    if (tree->base->type == GEN_IPADD) {
      print_nc_ipadd(bp, tree->base->d.ip);
    } else {
      GENERAL_NAME_print(bp, tree->base);
    }
    BIO_puts(bp, "\n");
  }
  return 1;
}